

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O2

void axl::io::createSockAddrNetMask_ip6(sockaddr_in6 *addr,size_t bitCount)

{
  size_t to;
  
  addr->sin6_family = 0;
  addr->sin6_port = 0;
  addr->sin6_flowinfo = 0;
  *(undefined8 *)&(addr->sin6_addr).__in6_u = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 4) = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 0xc) = 0;
  addr->sin6_family = 10;
  to = 0x80;
  if (bitCount < 0x80) {
    to = bitCount;
  }
  sl::setBitRange((size_t *)&addr->sin6_addr,2,0,to);
  return;
}

Assistant:

void
createSockAddrNetMask_ip6(
	sockaddr_in6* addr,
	size_t bitCount
) {
	memset(addr, 0, sizeof(sockaddr_in6));
	addr->sin6_family = AF_INET6;

	size_t maxBitCount = sizeof(addr->sin6_addr) * 8;
	if (bitCount > maxBitCount)
		bitCount = maxBitCount;

	sl::setBitRange(
		(size_t*)&addr->sin6_addr,
		sizeof(addr->sin6_addr) / sizeof(size_t),
		0,
		bitCount
	);
}